

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_file_server.cpp
# Opt level: O2

int module_unload(Server *server)

{
  _Base_ptr p_Var1;
  
  puts("Unloading module FileServer...");
  for (p_Var1 = filename_to_buffer_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &filename_to_buffer_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
      ; p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[3]._M_parent != (_Base_ptr)0x0) {
      operator_delete__(p_Var1[3]._M_parent);
    }
  }
  Server::remove_from_hook<HTTPResponse*(*)(Client*)>
            ((vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_> *)
             server,http_request_handler);
  puts("Unloaded module FileServer");
  return 0;
}

Assistant:

int module_unload(Server *server) {
    printf("Unloading module FileServer...\n");
    unload_file_from_mem();
    Server::remove_from_hook(server->http_request_hook, &http_request_handler);
    printf("Unloaded module FileServer\n");
    return 0;
}